

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  Geometry *pGVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  AABBNodeMB4D *node1;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  Scene *pSVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [8];
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  float fVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar42;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar43;
  float fVar55;
  float fVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar57;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar69;
  float fVar70;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar72;
  float fVar73;
  undefined1 auVar68 [16];
  float fVar74;
  float fVar89;
  float fVar90;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar91;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  float fVar93;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar106;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  undefined1 auVar131 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar141 [64];
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar147 [64];
  float fVar154;
  undefined1 auVar155 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar156 [64];
  float fVar160;
  undefined1 auVar161 [16];
  float fVar166;
  undefined1 auVar162 [16];
  float fVar164;
  float fVar165;
  undefined1 auVar163 [64];
  float fVar167;
  float fVar172;
  undefined1 auVar168 [16];
  float fVar170;
  float fVar171;
  float fVar173;
  undefined1 auVar169 [64];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_af9;
  undefined1 local_af8 [8];
  float fStack_af0;
  float fStack_aec;
  undefined1 local_ae8 [16];
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  undefined8 local_ac8;
  float fStack_ac0;
  float fStack_abc;
  Ray *local_ab8;
  int local_aac;
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  undefined1 local_a98 [8];
  float fStack_a90;
  float fStack_a8c;
  undefined1 local_a88 [8];
  float fStack_a80;
  float fStack_a7c;
  RayQueryContext *local_a78;
  Scene *local_a70;
  undefined1 local_a68 [8];
  float fStack_a60;
  float fStack_a5c;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [8];
  float fStack_a30;
  float fStack_a2c;
  ulong local_a28;
  long local_a20;
  long local_a18;
  ulong *local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  RTCFilterFunctionNArguments local_9d8;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar145 = ray->tfar;
    auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar145) {
      local_a10 = local_7d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar46._8_4_ = 0x7fffffff;
      auVar46._0_8_ = 0x7fffffff7fffffff;
      auVar46._12_4_ = 0x7fffffff;
      auVar46 = vandps_avx((undefined1  [16])aVar5,auVar46);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar46 = vcmpps_avx(auVar46,auVar94,1);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar94 = vdivps_avx(auVar95,(undefined1  [16])aVar5);
      auVar96._8_4_ = 0x5d5e0b6b;
      auVar96._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar96._12_4_ = 0x5d5e0b6b;
      auVar46 = vblendvps_avx(auVar94,auVar96,auVar46);
      auVar75._0_4_ = auVar46._0_4_ * 0.99999964;
      auVar75._4_4_ = auVar46._4_4_ * 0.99999964;
      auVar75._8_4_ = auVar46._8_4_ * 0.99999964;
      auVar75._12_4_ = auVar46._12_4_ * 0.99999964;
      auVar59._0_4_ = auVar46._0_4_ * 1.0000004;
      auVar59._4_4_ = auVar46._4_4_ * 1.0000004;
      auVar59._8_4_ = auVar46._8_4_ * 1.0000004;
      auVar59._12_4_ = auVar46._12_4_ * 1.0000004;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_908._4_4_ = uVar4;
      local_908._0_4_ = uVar4;
      local_908._8_4_ = uVar4;
      local_908._12_4_ = uVar4;
      auVar117 = ZEXT1664(local_908);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_918._4_4_ = uVar4;
      local_918._0_4_ = uVar4;
      local_918._8_4_ = uVar4;
      local_918._12_4_ = uVar4;
      auVar131 = ZEXT1664(local_918);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_928._4_4_ = uVar4;
      local_928._0_4_ = uVar4;
      local_928._8_4_ = uVar4;
      local_928._12_4_ = uVar4;
      auVar138 = ZEXT1664(local_928);
      local_938 = vshufps_avx(auVar75,auVar75,0);
      auVar139 = ZEXT1664(local_938);
      auVar46 = vmovshdup_avx(auVar75);
      local_948 = vshufps_avx(auVar75,auVar75,0x55);
      auVar141 = ZEXT1664(local_948);
      auVar94 = vshufpd_avx(auVar75,auVar75,1);
      local_958 = vshufps_avx(auVar75,auVar75,0xaa);
      auVar147 = ZEXT1664(local_958);
      local_968 = vshufps_avx(auVar59,auVar59,0);
      auVar156 = ZEXT1664(local_968);
      local_978 = vshufps_avx(auVar59,auVar59,0x55);
      auVar163 = ZEXT1664(local_978);
      uVar18 = (ulong)(auVar75._0_4_ < 0.0) << 4;
      uVar31 = (ulong)(auVar46._0_4_ < 0.0) << 4 | 0x20;
      local_988 = vshufps_avx(auVar59,auVar59,0xaa);
      auVar112 = ZEXT1664(local_988);
      uVar24 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x40;
      uVar32 = uVar18 ^ 0x10;
      local_998 = vshufps_avx(auVar34,auVar34,0);
      auVar169 = ZEXT1664(local_998);
      local_8b8 = vshufps_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),0);
      local_9a8 = mm_lookupmask_ps._240_8_;
      uStack_9a0 = mm_lookupmask_ps._248_8_;
      local_a78 = context;
      local_a28 = uVar18;
      local_ab8 = ray;
LAB_00b712d7:
      if (local_a10 != local_7d8) {
        uVar33 = local_a10[-1];
        local_a10 = local_a10 + -1;
        do {
          fVar145 = (ray->dir).field_0.m128[3];
          auVar34._4_4_ = fVar145;
          auVar34._0_4_ = fVar145;
          auVar34._8_4_ = fVar145;
          auVar34._12_4_ = fVar145;
          do {
            if ((uVar33 & 8) != 0) {
              local_a18 = (ulong)((uint)uVar33 & 0xf) - 8;
              uVar33 = uVar33 & 0xfffffffffffffff0;
              local_a20 = 0;
              goto LAB_00b71473;
            }
            uVar14 = uVar33 & 0xfffffffffffffff0;
            pfVar3 = (float *)(uVar14 + 0x80 + uVar18);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar18);
            auVar44._0_4_ = fVar145 * *pfVar3 + *pfVar1;
            auVar44._4_4_ = fVar145 * pfVar3[1] + pfVar1[1];
            auVar44._8_4_ = fVar145 * pfVar3[2] + pfVar1[2];
            auVar44._12_4_ = fVar145 * pfVar3[3] + pfVar1[3];
            auVar46 = vsubps_avx(auVar44,auVar117._0_16_);
            auVar45._0_4_ = auVar139._0_4_ * auVar46._0_4_;
            auVar45._4_4_ = auVar139._4_4_ * auVar46._4_4_;
            auVar45._8_4_ = auVar139._8_4_ * auVar46._8_4_;
            auVar45._12_4_ = auVar139._12_4_ * auVar46._12_4_;
            pfVar3 = (float *)(uVar14 + 0x80 + uVar31);
            auVar46 = vmaxps_avx(auVar169._0_16_,auVar45);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar31);
            auVar60._0_4_ = fVar145 * *pfVar3 + *pfVar1;
            auVar60._4_4_ = fVar145 * pfVar3[1] + pfVar1[1];
            auVar60._8_4_ = fVar145 * pfVar3[2] + pfVar1[2];
            auVar60._12_4_ = fVar145 * pfVar3[3] + pfVar1[3];
            auVar94 = vsubps_avx(auVar60,auVar131._0_16_);
            pfVar3 = (float *)(uVar14 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar24);
            auVar76._0_4_ = fVar145 * *pfVar3 + *pfVar1;
            auVar76._4_4_ = fVar145 * pfVar3[1] + pfVar1[1];
            auVar76._8_4_ = fVar145 * pfVar3[2] + pfVar1[2];
            auVar76._12_4_ = fVar145 * pfVar3[3] + pfVar1[3];
            auVar61._0_4_ = auVar141._0_4_ * auVar94._0_4_;
            auVar61._4_4_ = auVar141._4_4_ * auVar94._4_4_;
            auVar61._8_4_ = auVar141._8_4_ * auVar94._8_4_;
            auVar61._12_4_ = auVar141._12_4_ * auVar94._12_4_;
            auVar94 = vsubps_avx(auVar76,auVar138._0_16_);
            auVar77._0_4_ = auVar147._0_4_ * auVar94._0_4_;
            auVar77._4_4_ = auVar147._4_4_ * auVar94._4_4_;
            auVar77._8_4_ = auVar147._8_4_ * auVar94._8_4_;
            auVar77._12_4_ = auVar147._12_4_ * auVar94._12_4_;
            auVar94 = vmaxps_avx(auVar61,auVar77);
            pfVar3 = (float *)(uVar14 + 0x80 + uVar32);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar32);
            auVar78._0_4_ = fVar145 * *pfVar3 + *pfVar1;
            auVar78._4_4_ = fVar145 * pfVar3[1] + pfVar1[1];
            auVar78._8_4_ = fVar145 * pfVar3[2] + pfVar1[2];
            auVar78._12_4_ = fVar145 * pfVar3[3] + pfVar1[3];
            auVar46 = vmaxps_avx(auVar46,auVar94);
            auVar94 = vsubps_avx(auVar78,auVar117._0_16_);
            auVar62._0_4_ = auVar156._0_4_ * auVar94._0_4_;
            auVar62._4_4_ = auVar156._4_4_ * auVar94._4_4_;
            auVar62._8_4_ = auVar156._8_4_ * auVar94._8_4_;
            auVar62._12_4_ = auVar156._12_4_ * auVar94._12_4_;
            auVar94 = vminps_avx(local_8b8,auVar62);
            pfVar3 = (float *)(uVar14 + 0x80 + (uVar31 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar31 ^ 0x10));
            auVar79._0_4_ = fVar145 * *pfVar3 + *pfVar1;
            auVar79._4_4_ = fVar145 * pfVar3[1] + pfVar1[1];
            auVar79._8_4_ = fVar145 * pfVar3[2] + pfVar1[2];
            auVar79._12_4_ = fVar145 * pfVar3[3] + pfVar1[3];
            auVar59 = vsubps_avx(auVar79,auVar131._0_16_);
            auVar80._0_4_ = auVar163._0_4_ * auVar59._0_4_;
            auVar80._4_4_ = auVar163._4_4_ * auVar59._4_4_;
            auVar80._8_4_ = auVar163._8_4_ * auVar59._8_4_;
            auVar80._12_4_ = auVar163._12_4_ * auVar59._12_4_;
            pfVar3 = (float *)(uVar14 + 0x80 + (uVar24 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar24 ^ 0x10));
            auVar97._0_4_ = fVar145 * *pfVar3 + *pfVar1;
            auVar97._4_4_ = fVar145 * pfVar3[1] + pfVar1[1];
            auVar97._8_4_ = fVar145 * pfVar3[2] + pfVar1[2];
            auVar97._12_4_ = fVar145 * pfVar3[3] + pfVar1[3];
            auVar59 = vsubps_avx(auVar97,auVar138._0_16_);
            auVar98._0_4_ = auVar112._0_4_ * auVar59._0_4_;
            auVar98._4_4_ = auVar112._4_4_ * auVar59._4_4_;
            auVar98._8_4_ = auVar112._8_4_ * auVar59._8_4_;
            auVar98._12_4_ = auVar112._12_4_ * auVar59._12_4_;
            auVar59 = vminps_avx(auVar80,auVar98);
            auVar94 = vminps_avx(auVar94,auVar59);
            auVar46 = vcmpps_avx(auVar46,auVar94,2);
            if (((uint)uVar33 & 7) == 6) {
              auVar94 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0xe0),auVar34,2);
              auVar59 = vcmpps_avx(auVar34,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
              auVar94 = vandps_avx(auVar94,auVar59);
              auVar46 = vandps_avx(auVar94,auVar46);
            }
            auVar46 = vpslld_avx(auVar46,0x1f);
            uVar15 = vmovmskps_avx(auVar46);
            if (uVar15 == 0) goto LAB_00b712d7;
            lVar8 = 0;
            if ((byte)uVar15 != 0) {
              for (; ((byte)uVar15 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            uVar33 = *(ulong *)(uVar14 + lVar8 * 8);
            uVar15 = (uVar15 & 0xff) - 1 & uVar15 & 0xff;
            uVar16 = (ulong)uVar15;
          } while (uVar15 == 0);
          do {
            *local_a10 = uVar33;
            local_a10 = local_a10 + 1;
            lVar8 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            uVar33 = *(ulong *)(uVar14 + lVar8 * 8);
            uVar16 = uVar16 - 1 & uVar16;
          } while (uVar16 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00b71473:
  if (local_a20 == local_a18) goto LAB_00b712d7;
  lVar30 = local_a20 * 0x50;
  pSVar23 = context->scene;
  local_a70 = pSVar23;
  pGVar7 = (pSVar23->geometries).items[*(uint *)(uVar33 + 0x30 + lVar30)].ptr;
  fVar145 = (pGVar7->time_range).lower;
  fVar145 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar145) / ((pGVar7->time_range).upper - fVar145));
  auVar46 = vroundss_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),9);
  auVar46 = vminss_avx(auVar46,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar48 = vmaxss_avx(auVar124._0_16_,auVar46);
  lVar17 = (long)(int)auVar48._0_4_ * 0x38;
  uVar27 = (ulong)*(uint *)(uVar33 + 4 + lVar30);
  lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar17);
  lVar17 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar17);
  auVar46 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar33 + lVar30) * 4);
  uVar25 = (ulong)*(uint *)(uVar33 + 0x10 + lVar30);
  auVar94 = *(undefined1 (*) [16])(lVar8 + uVar25 * 4);
  uVar16 = (ulong)*(uint *)(uVar33 + 0x20 + lVar30);
  auVar81 = *(undefined1 (*) [16])(lVar8 + uVar16 * 4);
  auVar34 = *(undefined1 (*) [16])(lVar8 + uVar27 * 4);
  uVar19 = (ulong)*(uint *)(uVar33 + 0x14 + lVar30);
  auVar59 = *(undefined1 (*) [16])(lVar8 + uVar19 * 4);
  uVar20 = (ulong)*(uint *)(uVar33 + 0x24 + lVar30);
  auVar82 = *(undefined1 (*) [16])(lVar8 + uVar20 * 4);
  uVar28 = (ulong)*(uint *)(uVar33 + 8 + lVar30);
  auVar75 = *(undefined1 (*) [16])(lVar8 + uVar28 * 4);
  uVar18 = (ulong)*(uint *)(uVar33 + 0x18 + lVar30);
  auVar95 = *(undefined1 (*) [16])(lVar8 + uVar18 * 4);
  uVar21 = (ulong)*(uint *)(uVar33 + 0x28 + lVar30);
  auVar96 = *(undefined1 (*) [16])(lVar8 + uVar21 * 4);
  uVar22 = (ulong)*(uint *)(uVar33 + 0xc + lVar30);
  auVar6 = *(undefined1 (*) [16])(lVar8 + uVar22 * 4);
  uVar26 = (ulong)*(uint *)(uVar33 + 0x1c + lVar30);
  auVar35 = *(undefined1 (*) [16])(lVar8 + uVar26 * 4);
  uVar14 = (ulong)*(uint *)(uVar33 + 0x2c + lVar30);
  auVar36 = *(undefined1 (*) [16])(lVar8 + uVar14 * 4);
  auVar37 = *(undefined1 (*) [16])(lVar17 + (ulong)*(uint *)(uVar33 + lVar30) * 4);
  auVar47 = *(undefined1 (*) [16])(lVar17 + uVar25 * 4);
  fVar145 = fVar145 - auVar48._0_4_;
  auVar48 = vunpcklps_avx(auVar46,auVar75);
  auVar75 = vunpckhps_avx(auVar46,auVar75);
  auVar49 = vunpcklps_avx(auVar34,auVar6);
  auVar34 = vunpckhps_avx(auVar34,auVar6);
  auVar46 = *(undefined1 (*) [16])(lVar17 + uVar27 * 4);
  auVar63 = vunpcklps_avx(auVar75,auVar34);
  auVar64 = vunpcklps_avx(auVar48,auVar49);
  auVar75 = vunpckhps_avx(auVar48,auVar49);
  auVar6 = vunpcklps_avx(auVar94,auVar95);
  auVar34 = vunpckhps_avx(auVar94,auVar95);
  auVar95 = vunpcklps_avx(auVar59,auVar35);
  auVar59 = vunpckhps_avx(auVar59,auVar35);
  auVar94 = *(undefined1 (*) [16])(lVar17 + uVar28 * 4);
  auVar35 = vunpcklps_avx(auVar34,auVar59);
  auVar48 = vunpcklps_avx(auVar6,auVar95);
  auVar59 = vunpckhps_avx(auVar6,auVar95);
  auVar6 = vunpcklps_avx(auVar81,auVar96);
  auVar95 = vunpckhps_avx(auVar81,auVar96);
  auVar49 = vunpcklps_avx(auVar82,auVar36);
  auVar96 = vunpckhps_avx(auVar82,auVar36);
  auVar34 = *(undefined1 (*) [16])(lVar17 + uVar22 * 4);
  auVar36 = vunpcklps_avx(auVar95,auVar96);
  auVar81 = vunpcklps_avx(auVar6,auVar49);
  auVar95 = vunpckhps_avx(auVar6,auVar49);
  auVar96 = vunpcklps_avx(auVar37,auVar94);
  auVar94 = vunpckhps_avx(auVar37,auVar94);
  auVar6 = vunpcklps_avx(auVar46,auVar34);
  auVar34 = vunpckhps_avx(auVar46,auVar34);
  auVar46 = *(undefined1 (*) [16])(lVar17 + uVar18 * 4);
  auVar37 = vunpcklps_avx(auVar94,auVar34);
  auVar49 = vunpcklps_avx(auVar96,auVar6);
  auVar34 = vunpckhps_avx(auVar96,auVar6);
  auVar6 = vunpcklps_avx(auVar47,auVar46);
  auVar96 = vunpckhps_avx(auVar47,auVar46);
  auVar46 = *(undefined1 (*) [16])(lVar17 + uVar19 * 4);
  auVar94 = *(undefined1 (*) [16])(lVar17 + uVar26 * 4);
  auVar47 = vunpcklps_avx(auVar46,auVar94);
  auVar46 = vunpckhps_avx(auVar46,auVar94);
  auVar82 = vunpcklps_avx(auVar96,auVar46);
  auVar83 = vunpcklps_avx(auVar6,auVar47);
  auVar96 = vunpckhps_avx(auVar6,auVar47);
  auVar46 = *(undefined1 (*) [16])(lVar17 + uVar16 * 4);
  auVar94 = *(undefined1 (*) [16])(lVar17 + uVar21 * 4);
  auVar47 = vunpcklps_avx(auVar46,auVar94);
  auVar6 = vunpckhps_avx(auVar46,auVar94);
  auVar46 = *(undefined1 (*) [16])(lVar17 + uVar20 * 4);
  auVar94 = *(undefined1 (*) [16])(lVar17 + uVar14 * 4);
  auVar84 = vunpcklps_avx(auVar46,auVar94);
  auVar46 = vunpckhps_avx(auVar46,auVar94);
  auVar100 = vunpcklps_avx(auVar6,auVar46);
  auVar101 = vunpcklps_avx(auVar47,auVar84);
  auVar6 = vunpckhps_avx(auVar47,auVar84);
  auVar46 = vshufps_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),0);
  auVar94 = vshufps_avx(ZEXT416((uint)(1.0 - fVar145)),ZEXT416((uint)(1.0 - fVar145)),0);
  fVar69 = auVar46._0_4_;
  fVar70 = auVar46._4_4_;
  fVar73 = auVar46._8_4_;
  fVar172 = auVar46._12_4_;
  fVar145 = auVar94._0_4_;
  fVar148 = auVar94._4_4_;
  fVar150 = auVar94._8_4_;
  fVar152 = auVar94._12_4_;
  auVar113._0_4_ = fVar145 * auVar64._0_4_ + fVar69 * auVar49._0_4_;
  auVar113._4_4_ = fVar148 * auVar64._4_4_ + fVar70 * auVar49._4_4_;
  auVar113._8_4_ = fVar150 * auVar64._8_4_ + fVar73 * auVar49._8_4_;
  auVar113._12_4_ = fVar152 * auVar64._12_4_ + fVar172 * auVar49._12_4_;
  auVar118._0_4_ = fVar145 * auVar75._0_4_ + fVar69 * auVar34._0_4_;
  auVar118._4_4_ = fVar148 * auVar75._4_4_ + fVar70 * auVar34._4_4_;
  auVar118._8_4_ = fVar150 * auVar75._8_4_ + fVar73 * auVar34._8_4_;
  auVar118._12_4_ = fVar152 * auVar75._12_4_ + fVar172 * auVar34._12_4_;
  local_a68._0_4_ = auVar63._0_4_;
  local_a68._4_4_ = auVar63._4_4_;
  fStack_a60 = auVar63._8_4_;
  fStack_a5c = auVar63._12_4_;
  auVar99._0_4_ = fVar145 * (float)local_a68._0_4_ + fVar69 * auVar37._0_4_;
  auVar99._4_4_ = fVar148 * (float)local_a68._4_4_ + fVar70 * auVar37._4_4_;
  auVar99._8_4_ = fVar150 * fStack_a60 + fVar73 * auVar37._8_4_;
  auVar99._12_4_ = fVar152 * fStack_a5c + fVar172 * auVar37._12_4_;
  auVar126._0_4_ = fVar145 * auVar48._0_4_ + fVar69 * auVar83._0_4_;
  auVar126._4_4_ = fVar148 * auVar48._4_4_ + fVar70 * auVar83._4_4_;
  auVar126._8_4_ = fVar150 * auVar48._8_4_ + fVar73 * auVar83._8_4_;
  auVar126._12_4_ = fVar152 * auVar48._12_4_ + fVar172 * auVar83._12_4_;
  auVar108._0_4_ = fVar145 * auVar59._0_4_ + fVar69 * auVar96._0_4_;
  auVar108._4_4_ = fVar148 * auVar59._4_4_ + fVar70 * auVar96._4_4_;
  auVar108._8_4_ = fVar150 * auVar59._8_4_ + fVar73 * auVar96._8_4_;
  auVar108._12_4_ = fVar152 * auVar59._12_4_ + fVar172 * auVar96._12_4_;
  puVar2 = (undefined8 *)(uVar33 + 0x30 + lVar30);
  local_898 = *puVar2;
  uStack_890 = puVar2[1];
  puVar2 = (undefined8 *)(uVar33 + 0x40 + lVar30);
  local_af8._0_4_ = auVar35._0_4_;
  local_af8._4_4_ = auVar35._4_4_;
  fStack_af0 = auVar35._8_4_;
  fStack_aec = auVar35._12_4_;
  auVar47._0_4_ = fVar145 * (float)local_af8._0_4_ + fVar69 * auVar82._0_4_;
  auVar47._4_4_ = fVar148 * (float)local_af8._4_4_ + fVar70 * auVar82._4_4_;
  auVar47._8_4_ = fVar150 * fStack_af0 + fVar73 * auVar82._8_4_;
  auVar47._12_4_ = fVar152 * fStack_aec + fVar172 * auVar82._12_4_;
  local_a38._0_4_ = auVar81._0_4_;
  local_a38._4_4_ = auVar81._4_4_;
  fStack_a30 = auVar81._8_4_;
  fStack_a2c = auVar81._12_4_;
  auVar63._0_4_ = fVar145 * (float)local_a38._0_4_ + fVar69 * auVar101._0_4_;
  auVar63._4_4_ = fVar148 * (float)local_a38._4_4_ + fVar70 * auVar101._4_4_;
  auVar63._8_4_ = fVar150 * fStack_a30 + fVar73 * auVar101._8_4_;
  auVar63._12_4_ = fVar152 * fStack_a2c + fVar172 * auVar101._12_4_;
  local_a98._0_4_ = auVar95._0_4_;
  local_a98._4_4_ = auVar95._4_4_;
  fStack_a90 = auVar95._8_4_;
  fStack_a8c = auVar95._12_4_;
  auVar168._0_4_ = fVar145 * (float)local_a98._0_4_ + fVar69 * auVar6._0_4_;
  auVar168._4_4_ = fVar148 * (float)local_a98._4_4_ + fVar70 * auVar6._4_4_;
  auVar168._8_4_ = fVar150 * fStack_a90 + fVar73 * auVar6._8_4_;
  auVar168._12_4_ = fVar152 * fStack_a8c + fVar172 * auVar6._12_4_;
  local_a88._0_4_ = auVar36._0_4_;
  local_a88._4_4_ = auVar36._4_4_;
  fStack_a80 = auVar36._8_4_;
  fStack_a7c = auVar36._12_4_;
  auVar135._0_4_ = fVar69 * auVar100._0_4_ + fVar145 * (float)local_a88._0_4_;
  auVar135._4_4_ = fVar70 * auVar100._4_4_ + fVar148 * (float)local_a88._4_4_;
  auVar135._8_4_ = fVar73 * auVar100._8_4_ + fVar150 * fStack_a80;
  auVar135._12_4_ = fVar172 * auVar100._12_4_ + fVar152 * fStack_a7c;
  local_8a8 = *puVar2;
  uStack_8a0 = puVar2[1];
  uVar4 = *(undefined4 *)&(local_ab8->org).field_0;
  auVar35._4_4_ = uVar4;
  auVar35._0_4_ = uVar4;
  auVar35._8_4_ = uVar4;
  auVar35._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(local_ab8->org).field_0 + 4);
  auVar155._4_4_ = uVar4;
  auVar155._0_4_ = uVar4;
  auVar155._8_4_ = uVar4;
  auVar155._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(local_ab8->org).field_0 + 8);
  auVar161._4_4_ = uVar4;
  auVar161._0_4_ = uVar4;
  auVar161._8_4_ = uVar4;
  auVar161._12_4_ = uVar4;
  _local_af8 = vsubps_avx(auVar113,auVar35);
  _local_a88 = vsubps_avx(auVar118,auVar155);
  _local_a98 = vsubps_avx(auVar99,auVar161);
  auVar46 = vsubps_avx(auVar126,auVar35);
  auVar94 = vsubps_avx(auVar108,auVar155);
  auVar34 = vsubps_avx(auVar47,auVar161);
  auVar59 = vsubps_avx(auVar63,auVar35);
  auVar75 = vsubps_avx(auVar168,auVar155);
  auVar95 = vsubps_avx(auVar135,auVar161);
  _local_a38 = vsubps_avx(auVar59,_local_af8);
  local_a48 = vsubps_avx(auVar75,_local_a88);
  local_a58 = vsubps_avx(auVar95,_local_a98);
  fVar145 = local_a88._0_4_;
  fVar43 = auVar75._0_4_ + fVar145;
  fVar152 = local_a88._4_4_;
  fVar55 = auVar75._4_4_ + fVar152;
  fVar73 = local_a88._8_4_;
  fVar56 = auVar75._8_4_ + fVar73;
  fVar10 = local_a88._12_4_;
  fVar57 = auVar75._12_4_ + fVar10;
  fVar148 = local_a98._0_4_;
  fVar92 = auVar95._0_4_ + fVar148;
  fVar69 = local_a98._4_4_;
  fVar102 = auVar95._4_4_ + fVar69;
  fVar172 = local_a98._8_4_;
  fVar104 = auVar95._8_4_ + fVar172;
  fVar11 = local_a98._12_4_;
  fVar106 = auVar95._12_4_ + fVar11;
  fVar58 = local_a58._0_4_;
  auVar127._0_4_ = fVar58 * fVar43;
  fVar72 = local_a58._4_4_;
  auVar127._4_4_ = fVar72 * fVar55;
  fVar41 = local_a58._8_4_;
  auVar127._8_4_ = fVar41 * fVar56;
  fVar42 = local_a58._12_4_;
  auVar127._12_4_ = fVar42 * fVar57;
  fVar167 = local_a48._0_4_;
  auVar136._0_4_ = fVar167 * fVar92;
  fVar170 = local_a48._4_4_;
  auVar136._4_4_ = fVar170 * fVar102;
  fVar171 = local_a48._8_4_;
  auVar136._8_4_ = fVar171 * fVar104;
  fVar173 = local_a48._12_4_;
  auVar136._12_4_ = fVar173 * fVar106;
  auVar96 = vsubps_avx(auVar136,auVar127);
  fVar150 = local_af8._0_4_;
  fVar125 = auVar59._0_4_ + fVar150;
  fVar70 = local_af8._4_4_;
  fVar132 = auVar59._4_4_ + fVar70;
  fVar9 = local_af8._8_4_;
  fVar133 = auVar59._8_4_ + fVar9;
  fVar12 = local_af8._12_4_;
  fVar134 = auVar59._12_4_ + fVar12;
  fVar160 = local_a38._0_4_;
  auVar100._0_4_ = fVar160 * fVar92;
  fVar164 = local_a38._4_4_;
  auVar100._4_4_ = fVar164 * fVar102;
  fVar165 = local_a38._8_4_;
  auVar100._8_4_ = fVar165 * fVar104;
  fVar166 = local_a38._12_4_;
  auVar100._12_4_ = fVar166 * fVar106;
  auVar137._0_4_ = fVar125 * fVar58;
  auVar137._4_4_ = fVar132 * fVar72;
  auVar137._8_4_ = fVar133 * fVar41;
  auVar137._12_4_ = fVar134 * fVar42;
  auVar6 = vsubps_avx(auVar137,auVar100);
  auVar128._0_4_ = fVar167 * fVar125;
  auVar128._4_4_ = fVar170 * fVar132;
  auVar128._8_4_ = fVar171 * fVar133;
  auVar128._12_4_ = fVar173 * fVar134;
  auVar36._0_4_ = fVar160 * fVar43;
  auVar36._4_4_ = fVar164 * fVar55;
  auVar36._8_4_ = fVar165 * fVar56;
  auVar36._12_4_ = fVar166 * fVar57;
  auVar35 = vsubps_avx(auVar36,auVar128);
  fStack_ad4 = (local_ab8->dir).field_0.m128[2];
  local_ac8._4_4_ = (local_ab8->dir).field_0.m128[1];
  fStack_aa0 = (local_ab8->dir).field_0.m128[0];
  local_aa8 = CONCAT44(fStack_aa0,fStack_aa0);
  fStack_a9c = fStack_aa0;
  local_ae8._0_4_ =
       auVar96._0_4_ * fStack_aa0 + local_ac8._4_4_ * auVar6._0_4_ + fStack_ad4 * auVar35._0_4_;
  local_ae8._4_4_ =
       auVar96._4_4_ * fStack_aa0 + local_ac8._4_4_ * auVar6._4_4_ + fStack_ad4 * auVar35._4_4_;
  local_ae8._8_4_ =
       auVar96._8_4_ * fStack_aa0 + local_ac8._4_4_ * auVar6._8_4_ + fStack_ad4 * auVar35._8_4_;
  local_ae8._12_4_ =
       auVar96._12_4_ * fStack_aa0 + local_ac8._4_4_ * auVar6._12_4_ + fStack_ad4 * auVar35._12_4_;
  _local_a68 = vsubps_avx(_local_a88,auVar94);
  local_8d8 = vsubps_avx(_local_a98,auVar34);
  fVar55 = fVar145 + auVar94._0_4_;
  fVar57 = fVar152 + auVar94._4_4_;
  fVar102 = fVar73 + auVar94._8_4_;
  fVar106 = fVar10 + auVar94._12_4_;
  fVar125 = fVar148 + auVar34._0_4_;
  fVar132 = fVar69 + auVar34._4_4_;
  fVar133 = fVar172 + auVar34._8_4_;
  fVar134 = fVar11 + auVar34._12_4_;
  fVar43 = local_8d8._0_4_;
  auVar162._0_4_ = fVar43 * fVar55;
  fVar56 = local_8d8._4_4_;
  auVar162._4_4_ = fVar56 * fVar57;
  fVar92 = local_8d8._8_4_;
  auVar162._8_4_ = fVar92 * fVar102;
  fVar104 = local_8d8._12_4_;
  auVar162._12_4_ = fVar104 * fVar106;
  fVar154 = local_a68._0_4_;
  auVar81._0_4_ = fVar154 * fVar125;
  fVar157 = local_a68._4_4_;
  auVar81._4_4_ = fVar157 * fVar132;
  fVar158 = local_a68._8_4_;
  auVar81._8_4_ = fVar158 * fVar133;
  fVar159 = local_a68._12_4_;
  auVar81._12_4_ = fVar159 * fVar134;
  auVar96 = vsubps_avx(auVar81,auVar162);
  local_8c8 = vsubps_avx(_local_af8,auVar46);
  fVar140 = local_8c8._0_4_;
  auVar101._0_4_ = fVar140 * fVar125;
  fVar142 = local_8c8._4_4_;
  auVar101._4_4_ = fVar142 * fVar132;
  fVar143 = local_8c8._8_4_;
  auVar101._8_4_ = fVar143 * fVar133;
  fVar144 = local_8c8._12_4_;
  auVar101._12_4_ = fVar144 * fVar134;
  fVar125 = fVar150 + auVar46._0_4_;
  fVar132 = fVar70 + auVar46._4_4_;
  fVar133 = fVar9 + auVar46._8_4_;
  fVar134 = fVar12 + auVar46._12_4_;
  auVar129._0_4_ = fVar43 * fVar125;
  auVar129._4_4_ = fVar56 * fVar132;
  auVar129._8_4_ = fVar92 * fVar133;
  auVar129._12_4_ = fVar104 * fVar134;
  auVar6 = vsubps_avx(auVar129,auVar101);
  auVar119._0_4_ = fVar154 * fVar125;
  auVar119._4_4_ = fVar157 * fVar132;
  auVar119._8_4_ = fVar158 * fVar133;
  auVar119._12_4_ = fVar159 * fVar134;
  auVar37._0_4_ = fVar140 * fVar55;
  auVar37._4_4_ = fVar142 * fVar57;
  auVar37._8_4_ = fVar143 * fVar102;
  auVar37._12_4_ = fVar144 * fVar106;
  auVar35 = vsubps_avx(auVar37,auVar119);
  local_878._0_4_ =
       fStack_aa0 * auVar96._0_4_ + local_ac8._4_4_ * auVar6._0_4_ + fStack_ad4 * auVar35._0_4_;
  local_878._4_4_ =
       fStack_aa0 * auVar96._4_4_ + local_ac8._4_4_ * auVar6._4_4_ + fStack_ad4 * auVar35._4_4_;
  local_878._8_4_ =
       fStack_aa0 * auVar96._8_4_ + local_ac8._4_4_ * auVar6._8_4_ + fStack_ad4 * auVar35._8_4_;
  local_878._12_4_ =
       fStack_aa0 * auVar96._12_4_ + local_ac8._4_4_ * auVar6._12_4_ + fStack_ad4 * auVar35._12_4_;
  auVar96 = vsubps_avx(auVar46,auVar59);
  fVar74 = auVar46._0_4_ + auVar59._0_4_;
  fVar89 = auVar46._4_4_ + auVar59._4_4_;
  fVar90 = auVar46._8_4_ + auVar59._8_4_;
  fVar91 = auVar46._12_4_ + auVar59._12_4_;
  auVar46 = vsubps_avx(auVar94,auVar75);
  fVar132 = auVar94._0_4_ + auVar75._0_4_;
  fVar133 = auVar94._4_4_ + auVar75._4_4_;
  fVar134 = auVar94._8_4_ + auVar75._8_4_;
  fVar71 = auVar94._12_4_ + auVar75._12_4_;
  auVar94 = vsubps_avx(auVar34,auVar95);
  fVar57 = auVar34._0_4_ + auVar95._0_4_;
  fVar102 = auVar34._4_4_ + auVar95._4_4_;
  fVar106 = auVar34._8_4_ + auVar95._8_4_;
  fVar125 = auVar34._12_4_ + auVar95._12_4_;
  fVar93 = auVar94._0_4_;
  auVar109._0_4_ = fVar93 * fVar132;
  fVar103 = auVar94._4_4_;
  auVar109._4_4_ = fVar103 * fVar133;
  fVar105 = auVar94._8_4_;
  auVar109._8_4_ = fVar105 * fVar134;
  fVar107 = auVar94._12_4_;
  auVar109._12_4_ = fVar107 * fVar71;
  fVar146 = auVar46._0_4_;
  auVar120._0_4_ = fVar146 * fVar57;
  fVar149 = auVar46._4_4_;
  auVar120._4_4_ = fVar149 * fVar102;
  fVar151 = auVar46._8_4_;
  auVar120._8_4_ = fVar151 * fVar106;
  fVar153 = auVar46._12_4_;
  auVar120._12_4_ = fVar153 * fVar125;
  auVar46 = vsubps_avx(auVar120,auVar109);
  fVar55 = auVar96._0_4_;
  auVar48._0_4_ = fVar55 * fVar57;
  fVar57 = auVar96._4_4_;
  auVar48._4_4_ = fVar57 * fVar102;
  fVar102 = auVar96._8_4_;
  auVar48._8_4_ = fVar102 * fVar106;
  fVar106 = auVar96._12_4_;
  auVar48._12_4_ = fVar106 * fVar125;
  auVar121._0_4_ = fVar93 * fVar74;
  auVar121._4_4_ = fVar103 * fVar89;
  auVar121._8_4_ = fVar105 * fVar90;
  auVar121._12_4_ = fVar107 * fVar91;
  auVar94 = vsubps_avx(auVar121,auVar48);
  auVar82._0_4_ = fVar146 * fVar74;
  auVar82._4_4_ = fVar149 * fVar89;
  auVar82._8_4_ = fVar151 * fVar90;
  auVar82._12_4_ = fVar153 * fVar91;
  auVar64._0_4_ = fVar55 * fVar132;
  auVar64._4_4_ = fVar57 * fVar133;
  auVar64._8_4_ = fVar102 * fVar134;
  auVar64._12_4_ = fVar106 * fVar71;
  auVar34 = vsubps_avx(auVar64,auVar82);
  local_ad8 = fStack_ad4;
  fStack_ad0 = fStack_ad4;
  fStack_acc = fStack_ad4;
  local_ac8._0_4_ = local_ac8._4_4_;
  fStack_ac0 = local_ac8._4_4_;
  fStack_abc = local_ac8._4_4_;
  auVar49._0_4_ =
       fStack_aa0 * auVar46._0_4_ + local_ac8._4_4_ * auVar94._0_4_ + fStack_ad4 * auVar34._0_4_;
  auVar49._4_4_ =
       fStack_aa0 * auVar46._4_4_ + local_ac8._4_4_ * auVar94._4_4_ + fStack_ad4 * auVar34._4_4_;
  auVar49._8_4_ =
       fStack_aa0 * auVar46._8_4_ + local_ac8._4_4_ * auVar94._8_4_ + fStack_ad4 * auVar34._8_4_;
  auVar49._12_4_ =
       fStack_aa0 * auVar46._12_4_ + local_ac8._4_4_ * auVar94._12_4_ + fStack_ad4 * auVar34._12_4_;
  local_868._0_4_ = auVar49._0_4_ + local_ae8._0_4_ + local_878._0_4_;
  local_868._4_4_ = auVar49._4_4_ + local_ae8._4_4_ + local_878._4_4_;
  local_868._8_4_ = auVar49._8_4_ + local_ae8._8_4_ + local_878._8_4_;
  local_868._12_4_ = auVar49._12_4_ + local_ae8._12_4_ + local_878._12_4_;
  auVar46 = vminps_avx(local_ae8,local_878);
  auVar46 = vminps_avx(auVar46,auVar49);
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  local_8e8 = vandps_avx(local_868,auVar83);
  auVar84._0_4_ = local_8e8._0_4_ * 1.1920929e-07;
  auVar84._4_4_ = local_8e8._4_4_ * 1.1920929e-07;
  auVar84._8_4_ = local_8e8._8_4_ * 1.1920929e-07;
  auVar84._12_4_ = local_8e8._12_4_ * 1.1920929e-07;
  uVar18 = CONCAT44(auVar84._4_4_,auVar84._0_4_);
  auVar110._0_8_ = uVar18 ^ 0x8000000080000000;
  auVar110._8_4_ = -auVar84._8_4_;
  auVar110._12_4_ = -auVar84._12_4_;
  auVar46 = vcmpps_avx(auVar46,auVar110,5);
  auVar94 = vmaxps_avx(local_ae8,local_878);
  auVar94 = vmaxps_avx(auVar94,auVar49);
  auVar94 = vcmpps_avx(auVar94,auVar84,2);
  local_8f8 = vorps_avx(auVar46,auVar94);
  local_af9 = 0;
  auVar6._8_8_ = uStack_9a0;
  auVar6._0_8_ = local_9a8;
  auVar6 = auVar6 & local_8f8;
  ray = local_ab8;
  if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar6[0xf] < '\0') {
    auVar50._0_4_ = fVar154 * fVar58;
    auVar50._4_4_ = fVar157 * fVar72;
    auVar50._8_4_ = fVar158 * fVar41;
    auVar50._12_4_ = fVar159 * fVar42;
    auVar65._0_4_ = fVar167 * fVar43;
    auVar65._4_4_ = fVar170 * fVar56;
    auVar65._8_4_ = fVar171 * fVar92;
    auVar65._12_4_ = fVar173 * fVar104;
    auVar34 = vsubps_avx(auVar65,auVar50);
    auVar85._0_4_ = fVar43 * fVar146;
    auVar85._4_4_ = fVar56 * fVar149;
    auVar85._8_4_ = fVar92 * fVar151;
    auVar85._12_4_ = fVar104 * fVar153;
    auVar111._0_4_ = fVar154 * fVar93;
    auVar111._4_4_ = fVar157 * fVar103;
    auVar111._8_4_ = fVar158 * fVar105;
    auVar111._12_4_ = fVar159 * fVar107;
    auVar59 = vsubps_avx(auVar111,auVar85);
    auVar46 = vandps_avx(auVar83,auVar50);
    auVar94 = vandps_avx(auVar83,auVar85);
    auVar46 = vcmpps_avx(auVar46,auVar94,1);
    local_808 = vblendvps_avx(auVar59,auVar34,auVar46);
    auVar51._0_4_ = fVar140 * fVar93;
    auVar51._4_4_ = fVar142 * fVar103;
    auVar51._8_4_ = fVar143 * fVar105;
    auVar51._12_4_ = fVar144 * fVar107;
    auVar66._0_4_ = fVar140 * fVar58;
    auVar66._4_4_ = fVar142 * fVar72;
    auVar66._8_4_ = fVar143 * fVar41;
    auVar66._12_4_ = fVar144 * fVar42;
    auVar86._0_4_ = fVar43 * fVar160;
    auVar86._4_4_ = fVar56 * fVar164;
    auVar86._8_4_ = fVar92 * fVar165;
    auVar86._12_4_ = fVar104 * fVar166;
    auVar34 = vsubps_avx(auVar66,auVar86);
    auVar114._0_4_ = fVar43 * fVar55;
    auVar114._4_4_ = fVar56 * fVar57;
    auVar114._8_4_ = fVar92 * fVar102;
    auVar114._12_4_ = fVar104 * fVar106;
    auVar59 = vsubps_avx(auVar114,auVar51);
    auVar46 = vandps_avx(auVar83,auVar86);
    auVar94 = vandps_avx(auVar83,auVar51);
    auVar46 = vcmpps_avx(auVar46,auVar94,1);
    local_7f8 = vblendvps_avx(auVar59,auVar34,auVar46);
    auVar38._0_4_ = fVar154 * fVar55;
    auVar38._4_4_ = fVar157 * fVar57;
    auVar38._8_4_ = fVar158 * fVar102;
    auVar38._12_4_ = fVar159 * fVar106;
    auVar67._0_4_ = fVar154 * fVar160;
    auVar67._4_4_ = fVar157 * fVar164;
    auVar67._8_4_ = fVar158 * fVar165;
    auVar67._12_4_ = fVar159 * fVar166;
    auVar87._0_4_ = fVar167 * fVar140;
    auVar87._4_4_ = fVar170 * fVar142;
    auVar87._8_4_ = fVar171 * fVar143;
    auVar87._12_4_ = fVar173 * fVar144;
    auVar115._0_4_ = fVar140 * fVar146;
    auVar115._4_4_ = fVar142 * fVar149;
    auVar115._8_4_ = fVar143 * fVar151;
    auVar115._12_4_ = fVar144 * fVar153;
    auVar34 = vsubps_avx(auVar67,auVar87);
    auVar59 = vsubps_avx(auVar115,auVar38);
    auVar46 = vandps_avx(auVar83,auVar87);
    auVar94 = vandps_avx(auVar83,auVar38);
    auVar46 = vcmpps_avx(auVar46,auVar94,1);
    local_7e8 = vblendvps_avx(auVar59,auVar34,auVar46);
    fVar58 = local_808._0_4_ * fStack_aa0 +
             local_7f8._0_4_ * local_ac8._4_4_ + local_7e8._0_4_ * fStack_ad4;
    fVar43 = local_808._4_4_ * fStack_aa0 +
             local_7f8._4_4_ * local_ac8._4_4_ + local_7e8._4_4_ * fStack_ad4;
    fVar55 = local_808._8_4_ * fStack_aa0 +
             local_7f8._8_4_ * local_ac8._4_4_ + local_7e8._8_4_ * fStack_ad4;
    fVar72 = local_808._12_4_ * fStack_aa0 +
             local_7f8._12_4_ * local_ac8._4_4_ + local_7e8._12_4_ * fStack_ad4;
    auVar88._0_4_ = fVar58 + fVar58;
    auVar88._4_4_ = fVar43 + fVar43;
    auVar88._8_4_ = fVar55 + fVar55;
    auVar88._12_4_ = fVar72 + fVar72;
    fVar58 = local_808._0_4_ * fVar150 + local_7f8._0_4_ * fVar145 + local_7e8._0_4_ * fVar148;
    fVar69 = local_808._4_4_ * fVar70 + local_7f8._4_4_ * fVar152 + local_7e8._4_4_ * fVar69;
    fVar70 = local_808._8_4_ * fVar9 + local_7f8._8_4_ * fVar73 + local_7e8._8_4_ * fVar172;
    fVar73 = local_808._12_4_ * fVar12 + local_7f8._12_4_ * fVar10 + local_7e8._12_4_ * fVar11;
    auVar46 = vrcpps_avx(auVar88);
    fVar145 = auVar46._0_4_;
    auVar122._0_4_ = auVar88._0_4_ * fVar145;
    fVar148 = auVar46._4_4_;
    auVar122._4_4_ = auVar88._4_4_ * fVar148;
    fVar150 = auVar46._8_4_;
    auVar122._8_4_ = auVar88._8_4_ * fVar150;
    fVar152 = auVar46._12_4_;
    auVar122._12_4_ = auVar88._12_4_ * fVar152;
    auVar130._8_4_ = 0x3f800000;
    auVar130._0_8_ = 0x3f8000003f800000;
    auVar130._12_4_ = 0x3f800000;
    auVar46 = vsubps_avx(auVar130,auVar122);
    local_818._0_4_ = (fVar58 + fVar58) * (fVar145 + fVar145 * auVar46._0_4_);
    local_818._4_4_ = (fVar69 + fVar69) * (fVar148 + fVar148 * auVar46._4_4_);
    local_818._8_4_ = (fVar70 + fVar70) * (fVar150 + fVar150 * auVar46._8_4_);
    local_818._12_4_ = (fVar73 + fVar73) * (fVar152 + fVar152 * auVar46._12_4_);
    uVar4 = *(undefined4 *)((long)&(local_ab8->org).field_0 + 0xc);
    auVar116._4_4_ = uVar4;
    auVar116._0_4_ = uVar4;
    auVar116._8_4_ = uVar4;
    auVar116._12_4_ = uVar4;
    auVar46 = vcmpps_avx(auVar116,local_818,2);
    fVar145 = local_ab8->tfar;
    auVar123._4_4_ = fVar145;
    auVar123._0_4_ = fVar145;
    auVar123._8_4_ = fVar145;
    auVar123._12_4_ = fVar145;
    auVar94 = vcmpps_avx(local_818,auVar123,2);
    auVar46 = vandps_avx(auVar46,auVar94);
    auVar94 = vcmpps_avx(auVar88,_DAT_01f45a50,4);
    auVar46 = vandps_avx(auVar94,auVar46);
    auVar13._8_8_ = uStack_9a0;
    auVar13._0_8_ = local_9a8;
    auVar94 = vpand_avx(local_8f8,auVar13);
    auVar46 = vpslld_avx(auVar46,0x1f);
    auVar46 = vpsrad_avx(auVar46,0x1f);
    local_848 = vpand_avx(auVar46,auVar94);
    uVar15 = vmovmskps_avx(local_848);
    if (uVar15 != 0) {
      local_888 = local_ae8;
      local_858 = &local_af9;
      auVar46 = vrcpps_avx(local_868);
      fVar145 = auVar46._0_4_;
      auVar52._0_4_ = local_868._0_4_ * fVar145;
      fVar148 = auVar46._4_4_;
      auVar52._4_4_ = local_868._4_4_ * fVar148;
      fVar150 = auVar46._8_4_;
      auVar52._8_4_ = local_868._8_4_ * fVar150;
      fVar152 = auVar46._12_4_;
      auVar52._12_4_ = local_868._12_4_ * fVar152;
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = 0x3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      auVar46 = vsubps_avx(auVar68,auVar52);
      auVar39._0_4_ = fVar145 + fVar145 * auVar46._0_4_;
      auVar39._4_4_ = fVar148 + fVar148 * auVar46._4_4_;
      auVar39._8_4_ = fVar150 + fVar150 * auVar46._8_4_;
      auVar39._12_4_ = fVar152 + fVar152 * auVar46._12_4_;
      auVar53._8_4_ = 0x219392ef;
      auVar53._0_8_ = 0x219392ef219392ef;
      auVar53._12_4_ = 0x219392ef;
      auVar46 = vcmpps_avx(local_8e8,auVar53,5);
      auVar46 = vandps_avx(auVar46,auVar39);
      auVar54._0_4_ = local_ae8._0_4_ * auVar46._0_4_;
      auVar54._4_4_ = local_ae8._4_4_ * auVar46._4_4_;
      auVar54._8_4_ = local_ae8._8_4_ * auVar46._8_4_;
      auVar54._12_4_ = local_ae8._12_4_ * auVar46._12_4_;
      local_838 = vminps_avx(auVar54,auVar68);
      auVar40._0_4_ = local_878._0_4_ * auVar46._0_4_;
      auVar40._4_4_ = local_878._4_4_ * auVar46._4_4_;
      auVar40._8_4_ = local_878._8_4_ * auVar46._8_4_;
      auVar40._12_4_ = local_878._12_4_ * auVar46._12_4_;
      local_828 = vminps_avx(auVar40,auVar68);
      local_aa8 = (ulong)(uVar15 & 0xff);
      do {
        uVar18 = 0;
        if (local_aa8 != 0) {
          for (; (local_aa8 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        local_9f0 = *(uint *)((long)&local_898 + uVar18 * 4);
        pGVar7 = (pSVar23->geometries).items[local_9f0].ptr;
        if ((pGVar7->mask & ray->mask) == 0) {
          local_aa8 = local_aa8 ^ 1L << (uVar18 & 0x3f);
        }
        else {
          auVar29 = (undefined1  [8])local_a78->args;
          if ((((RTCIntersectArguments *)auVar29)->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b71ee5;
          local_9d8.context = local_a78->user;
          local_a08 = *(undefined4 *)(local_808 + uVar18 * 4);
          local_a04 = *(undefined4 *)(local_7f8 + uVar18 * 4);
          local_a00 = *(undefined4 *)(local_7e8 + uVar18 * 4);
          local_9fc = *(undefined4 *)(local_838 + uVar18 * 4);
          local_9f8 = *(undefined4 *)(local_828 + uVar18 * 4);
          local_9f4 = *(undefined4 *)((long)&local_8a8 + uVar18 * 4);
          local_9ec = (local_9d8.context)->instID[0];
          local_9e8 = (local_9d8.context)->instPrimID[0];
          local_ad8 = ray->tfar;
          local_ac8 = uVar18;
          ray->tfar = *(float *)(local_818 + uVar18 * 4);
          local_aac = -1;
          local_9d8.valid = &local_aac;
          local_9d8.geometryUserPtr = pGVar7->userPtr;
          local_9d8.hit = (RTCHitN *)&local_a08;
          local_9d8.N = 1;
          local_ae8._0_8_ = pGVar7;
          local_9d8.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b71dd8:
            ray = local_ab8;
            if ((((RTCIntersectArguments *)auVar29)->filter == (RTCFilterFunctionN)0x0) ||
               ((((((RTCIntersectArguments *)auVar29)->flags &
                  RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                 ((*(byte *)(local_ae8._0_8_ + 0x3e) & 0x40) == 0)) ||
                ((*((RTCIntersectArguments *)auVar29)->filter)(&local_9d8), ray = local_ab8,
                *local_9d8.valid != 0)))) {
LAB_00b71ee5:
              ray->tfar = -INFINITY;
              return;
            }
          }
          else {
            local_af8 = auVar29;
            (*pGVar7->occlusionFilterN)(&local_9d8);
            auVar29 = local_af8;
            if (*local_9d8.valid != 0) goto LAB_00b71dd8;
          }
          local_ab8->tfar = local_ad8;
          local_aa8 = local_aa8 ^ 1L << (local_ac8 & 0x3f);
          pSVar23 = local_a70;
          ray = local_ab8;
        }
      } while (local_aa8 != 0);
    }
  }
  local_a20 = local_a20 + 1;
  auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar117 = ZEXT1664(local_908);
  auVar131 = ZEXT1664(local_918);
  auVar138 = ZEXT1664(local_928);
  auVar139 = ZEXT1664(local_938);
  auVar141 = ZEXT1664(local_948);
  auVar147 = ZEXT1664(local_958);
  auVar156 = ZEXT1664(local_968);
  auVar163 = ZEXT1664(local_978);
  auVar112 = ZEXT1664(local_988);
  auVar169 = ZEXT1664(local_998);
  context = local_a78;
  uVar18 = local_a28;
  goto LAB_00b71473;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }